

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# freelist.h
# Opt level: O0

QueueElement * __thiscall
MeCab::FreeList<MeCab::NBestGenerator::QueueElement>::alloc
          (FreeList<MeCab::NBestGenerator::QueueElement> *this)

{
  value_type pQVar1;
  long lVar2;
  undefined1 auVar3 [16];
  vector<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>
  *pvVar4;
  ulong uVar5;
  reference ppQVar6;
  value_type *__x;
  long in_RDI;
  vector<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>
  *this_00;
  
  if (*(long *)(in_RDI + 0x20) == *(long *)(in_RDI + 0x30)) {
    *(long *)(in_RDI + 0x28) = *(long *)(in_RDI + 0x28) + 1;
    *(undefined8 *)(in_RDI + 0x20) = 0;
  }
  this_00 = *(vector<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>
              **)(in_RDI + 0x28);
  pvVar4 = (vector<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>
            *)std::
              vector<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>
              ::size((vector<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>
                      *)(in_RDI + 8));
  if (this_00 == pvVar4) {
    __x = (value_type *)(in_RDI + 8);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = *(ulong *)(in_RDI + 0x30);
    uVar5 = SUB168(auVar3 * ZEXT816(0x20),0);
    if (SUB168(auVar3 * ZEXT816(0x20),8) != 0) {
      uVar5 = 0xffffffffffffffff;
    }
    operator_new__(uVar5);
    std::
    vector<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>
    ::push_back(this_00,__x);
  }
  ppQVar6 = std::
            vector<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>
            ::operator[]((vector<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>
                          *)(in_RDI + 8),*(size_type *)(in_RDI + 0x28));
  pQVar1 = *ppQVar6;
  lVar2 = *(long *)(in_RDI + 0x20);
  *(long *)(in_RDI + 0x20) = lVar2 + 1;
  return pQVar1 + lVar2;
}

Assistant:

T* alloc() {
    if (pi_ == size) {
      li_++;
      pi_ = 0;
    }
    if (li_ == freeList.size()) freeList.push_back(new T[size]);
    return freeList[li_] + (pi_++);
  }